

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool PrngTest<Blob<256>>(hashfunc<Blob<256>_> hash,bool testColl,bool testDist,bool drawDiagram)

{
  bool bVar1;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *unaff_retaddr;
  pfHash in_stack_00000008;
  bool result;
  int in_stack_00000014;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  bool in_stack_000000cb;
  bool in_stack_000000cc;
  bool in_stack_000000cd;
  bool in_stack_000000ce;
  bool in_stack_000000cf;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_000000d0;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_ffffffffffffffd0;
  hashfunc local_8 [8];
  
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)0x1a10d3);
  hashfunc::operator_cast_to_function_pointer(local_8);
  Prn_gen<Blob<256>>(in_stack_00000014,in_stack_00000008,unaff_retaddr);
  bVar1 = TestHashList<Blob<256>>
                    (in_stack_000000d0,in_stack_000000cf,in_stack_000000ce,in_stack_000000cd,
                     in_stack_000000cc,in_stack_000000cb);
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::~vector(in_stack_ffffffffffffffd0);
  return bVar1;
}

Assistant:

bool PrngTest ( hashfunc<hashtype> hash,
                bool testColl, bool testDist, bool drawDiagram )
{

  if (sizeof(hashtype) < 8) {
      printf("The PRNG test is designed for hashes >= 64-bit \n");
      return true;
  }

  //----------

  std::vector<hashtype> hashes;
  Prn_gen(32 << 20, hash, hashes);

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram,testColl,testDist);

  return result;
}